

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Architecture.cpp
# Opt level: O0

void __thiscall ArchitectureCommand::writeTempData(ArchitectureCommand *this,TempData *tempData)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  long lVar3;
  istream *piVar4;
  undefined1 local_1c0 [8];
  string line;
  stringstream stream;
  TempData *tempData_local;
  ArchitectureCommand *this_local;
  
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    _Var2 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)(line.field_2._M_local_buf + 8),(string *)&this->tempText,_Var2);
    std::__cxx11::string::string((string *)local_1c0);
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)(line.field_2._M_local_buf + 8),(string *)local_1c0,'\n');
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar1) break;
      lVar3 = std::__cxx11::string::size();
      if (lVar3 != 0) {
        TempData::writeLine(tempData,this->position,(string *)local_1c0);
      }
    }
    std::__cxx11::string::~string((string *)local_1c0);
    std::__cxx11::stringstream::~stringstream((stringstream *)(line.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void ArchitectureCommand::writeTempData(TempData& tempData) const
{
	if (tempText.size() != 0)
	{
		std::stringstream stream(tempText);

		std::string line;
		while (std::getline(stream,line,'\n'))
		{
			if (line.size() != 0)
				tempData.writeLine(position,line);
		}
	}
}